

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_test.cpp
# Opt level: O0

void operations_test<viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_variable<0ul>>
               (rt_constant<long,_viennamath::rt_expression_interface<double>_> *t,
               ct_variable<0UL> *u,double t2,double u2)

{
  ostream *poVar1;
  type local_138;
  type local_118;
  type local_f8;
  type local_d8;
  type local_b8;
  type local_98;
  type local_78;
  type local_48;
  double local_28;
  double u2_local;
  double t2_local;
  ct_variable<0UL> *u_local;
  rt_constant<long,_viennamath::rt_expression_interface<double>_> *t_local;
  
  local_28 = u2;
  u2_local = t2;
  t2_local = (double)u;
  u_local = (ct_variable<0UL> *)t;
  poVar1 = std::operator<<((ostream *)&std::cout,"LHS: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)
                             u_local);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,u2_local);
  poVar1 = std::operator<<(poVar1,"), RHS: ");
  poVar1 = viennamath::operator<<(poVar1,(ct_variable<0UL> *)t2_local);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_28);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  viennamath::operator+
            (&local_48,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)u_local,
             (ct_variable<0UL> *)t2_local);
  evaluations_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>
            (&local_48,u2_local + local_28);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_48);
  viennamath::operator+
            (&local_78,(ct_variable<0UL> *)t2_local,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)u_local);
  evaluations_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>
            (&local_78,local_28 + u2_local);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_78);
  viennamath::operator-
            (&local_98,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)u_local,
             (ct_variable<0UL> *)t2_local);
  evaluations_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>
            (&local_98,u2_local - local_28);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_98);
  viennamath::operator-
            (&local_b8,(ct_variable<0UL> *)t2_local,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)u_local);
  evaluations_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>
            (&local_b8,local_28 - u2_local);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_b8);
  viennamath::operator*
            (&local_d8,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)u_local,
             (ct_variable<0UL> *)t2_local);
  evaluations_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>
            (&local_d8,u2_local * local_28);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_d8);
  viennamath::operator*
            (&local_f8,(ct_variable<0UL> *)t2_local,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)u_local);
  evaluations_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>
            (&local_f8,local_28 * u2_local);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_f8);
  viennamath::operator/
            (&local_118,(rt_constant<long,_viennamath::rt_expression_interface<double>_> *)u_local,
             (ct_variable<0UL> *)t2_local);
  evaluations_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>
            (&local_118,u2_local / local_28);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_118);
  viennamath::operator/
            (&local_138,(ct_variable<0UL> *)t2_local,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)u_local);
  evaluations_test<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>>
            (&local_138,local_28 / u2_local);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_138);
  return;
}

Assistant:

void operations_test(T const & t, U const & u, double t2, double u2)
{
  std::cout << "LHS: " << t << " (" << t2 << "), RHS: " << u << "(" << u2 << ")" << std::endl;
  evaluations_test(t + u, t2 + u2);
  evaluations_test(u + t, u2 + t2);
  evaluations_test(t - u, t2 - u2);
  evaluations_test(u - t, u2 - t2);
  evaluations_test(t * u, t2 * u2);
  evaluations_test(u * t, u2 * t2);
  evaluations_test(t / u, t2 / u2);
  evaluations_test(u / t, u2 / t2);
}